

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O3

void __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
::consume(consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
          *this,size_t size)

{
  pointer pcVar1;
  difference_type __d;
  size_t sVar2;
  pointer pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  this->total_consumed_ = this->total_consumed_ + size;
  pcVar3 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar2 = this->next_elem_;
  if (size != 0 && pcVar3 + sVar2 != pcVar1) {
    sVar5 = this->next_elem_offset_;
    pcVar3 = pcVar3 + sVar2;
    do {
      sVar2 = sVar2 + 1;
      uVar6 = pcVar3->size_ - sVar5;
      if (pcVar3->size_ < sVar5) {
        uVar6 = 0;
      }
      uVar4 = size - uVar6;
      if (size < uVar6) {
        this->next_elem_offset_ = sVar5 + size;
        return;
      }
      this->next_elem_ = sVar2;
      this->next_elem_offset_ = 0;
    } while ((pcVar3 + 1 != pcVar1) && (sVar5 = 0, size = uVar4, pcVar3 = pcVar3 + 1, uVar4 != 0));
  }
  return;
}

Assistant:

void consume(std::size_t size)
  {
    total_consumed_ += size;

    Buffer_Iterator next = asio::buffer_sequence_begin(buffers_);
    Buffer_Iterator end = asio::buffer_sequence_end(buffers_);

    std::advance(next, next_elem_);
    while (next != end && size > 0)
    {
      Buffer next_buf = Buffer(*next) + next_elem_offset_;
      if (size < next_buf.size())
      {
        next_elem_offset_ += size;
        size = 0;
      }
      else
      {
        size -= next_buf.size();
        next_elem_offset_ = 0;
        ++next_elem_;
        ++next;
      }
    }
  }